

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5343ef::LaneBasedExecutionQueue::executeProcess
          (LaneBasedExecutionQueue *this,QueueJobContext *opaqueContext,
          ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  unordered_set<llvm::StringRef,_std::hash<llvm::StringRef>,_std::equal_to<llvm::StringRef>,_std::allocator<llvm::StringRef>_>
  *this_00;
  _func_int **pp_Var1;
  ProcessContext *ctx;
  char **ppcVar2;
  StringRef value;
  StringRef value_00;
  StringRef key;
  StringRef value_01;
  ArrayRef<llvm::StringRef> commandLine_00;
  QueueJobContext *pQVar3;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar5;
  char **ppcVar6;
  iterator __begin2;
  StringRef Separator;
  StringRef key_00;
  StringRef key_01;
  unique_lock<std::mutex> lock;
  ProcessReleaseFn releaseFn;
  ProcessCompletionFn laneCompletionFn;
  POSIXEnvironment posixEnv;
  SmallString<64U> description;
  undefined1 local_218 [32];
  undefined1 local_1f8;
  _func_int **local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  ProcessHandle local_1a8;
  QueueJobContext *local_1a0;
  StringRef *local_198;
  size_type local_190;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  POSIXEnvironment local_168;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [64];
  POSIXEnvironment local_a0;
  
  local_190 = commandLine.Length;
  local_198 = commandLine.Data;
  ppVar5 = environment.Data;
  local_f0 = local_e0;
  local_e8 = 0x4000000000;
  (**(code **)(*(long *)*opaqueContext[3]._vptr_QueueJobContext + 0x18))
            (*opaqueContext[3]._vptr_QueueJobContext,&local_f0);
  local_218._0_8_ = &this->readyJobsMutex;
  local_218[8] = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_218);
  local_218[8] = true;
  if (this->cancelled == true) {
    if ((completionFn->Storage).hasVal == true) {
      local_180 = 0;
      uStack_178 = 0;
      local_170 = 0;
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xffffffff00000002;
      local_168.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(uStack_184,0xffffffff);
      local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.envStorage.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
          == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
                (completionFn,&local_168);
    }
    if (local_218[8] == true) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_218);
    }
  }
  else {
    local_1a0 = opaqueContext;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_218);
    local_168.keys._M_h._M_buckets = &local_168.keys._M_h._M_single_bucket;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_168.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_168.keys._M_h._M_element_count = 0;
    local_168.keys._M_h._M_bucket_count = 1;
    local_168.keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_168.keys._M_h._M_rehash_policy._4_4_ = 0;
    local_168.keys._M_h._M_rehash_policy._M_next_resize = 0;
    local_168.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_168.isFrozen = false;
    local_1d8 = (code *)CONCAT62(local_1d8._2_6_,0x109);
    local_1e8._0_4_ = this->buildID;
    llvm::Twine::str_abi_cxx11_((string *)local_218,(Twine *)&local_1e8);
    value.Length._0_1_ = local_218[8];
    value.Data = (char *)local_218._0_8_;
    value.Length._1_7_ = local_218._9_7_;
    key_00.Length = 0x10;
    key_00.Data = "LLBUILD_BUILD_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key_00,value);
    if ((__hashtable_alloc *)local_218._0_8_ != (__hashtable_alloc *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    local_1d8 = (code *)CONCAT62(local_1d8._2_6_,0x10b);
    local_1e8._M_unused._M_object = opaqueContext + 2;
    llvm::Twine::str_abi_cxx11_((string *)local_218,(Twine *)&local_1e8);
    value_00.Length._0_1_ = local_218[8];
    value_00.Data = (char *)local_218._0_8_;
    value_00.Length._1_7_ = local_218._9_7_;
    key_01.Length = 0xf;
    key_01.Data = "LLBUILD_LANE_ID";
    llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key_01,value_00);
    if ((__hashtable_alloc *)local_218._0_8_ != (__hashtable_alloc *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    if (environment.Length != 0) {
      ppVar4 = ppVar5 + environment.Length;
      do {
        llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,ppVar5->first,ppVar5->second);
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar4);
    }
    if ((attributes.inheritEnvironment != false) && (*this->environment != (char *)0x0)) {
      ppcVar2 = this->environment;
      do {
        ppcVar6 = ppcVar2 + 1;
        local_1e8._M_unused._M_object = *ppcVar2;
        if ((_func_void *)local_1e8._M_unused._0_8_ == (_func_void *)0x0) {
          local_1e8._8_8_ = 0;
        }
        else {
          local_1e8._8_8_ = strlen((char *)local_1e8._M_unused._0_8_);
        }
        local_1c8._M_pod_data[0] = 0x3d;
        Separator.Length = 1;
        Separator.Data = (char *)&local_1c8;
        llvm::StringRef::split
                  ((pair<llvm::StringRef,_llvm::StringRef> *)local_218,(StringRef *)&local_1e8,
                   Separator);
        key.Length._0_1_ = local_218[8];
        key.Data = (char *)local_218._0_8_;
        key.Length._1_7_ = local_218._9_7_;
        value_01.Length = local_218._24_8_;
        value_01.Data = (char *)local_218._16_8_;
        llbuild::basic::POSIXEnvironment::setIfMissing(&local_168,key,value_01);
        ppcVar2 = ppcVar6;
      } while (*ppcVar6 != (char *)0x0);
    }
    pQVar3 = local_1a0;
    local_1a8.id = (uint64_t)local_1a0[1]._vptr_QueueJobContext;
    local_1e8._8_8_ = 0;
    pcStack_1d0 = std::
                  _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:434:34)>
                  ::_M_invoke;
    local_1d8 = std::
                _Function_handler<void_(std::function<void_()>_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:434:34)>
                ::_M_manager;
    local_1e8._M_unused._M_object = this;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               local_218,&completionFn->Storage);
    pp_Var1 = pQVar3[2]._vptr_QueueJobContext;
    local_1c8._M_unused._M_object = (void *)0x0;
    local_1c8._8_8_ = 0;
    local_1b8 = (code *)0x0;
    pcStack_1b0 = (code *)0x0;
    local_1f0 = pp_Var1;
    local_1c8._M_unused._M_object = operator_new(0x30);
    *(code *)((long)local_1c8._M_unused._0_8_ + 0x20) = local_1f8;
    if (local_1f8 == (code)0x1) {
      *(undefined8 *)local_1c8._M_unused._0_8_ = 0;
      *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 8) = 0;
      *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 0x10) = 0;
      *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 0x18) = local_218._24_8_;
      if ((code *)local_218._16_8_ != (code *)0x0) {
        *(undefined8 *)local_1c8._M_unused._0_8_ = local_218._0_8_;
        *(ulong *)((long)local_1c8._M_unused._0_8_ + 8) = CONCAT71(local_218._9_7_,local_218[8]);
        *(undefined8 *)((long)local_1c8._M_unused._0_8_ + 0x10) = local_218._16_8_;
        local_218._16_8_ = (code *)0x0;
        local_218._24_8_ = 0;
      }
    }
    *(_func_int ***)((long)local_1c8._M_unused._0_8_ + 0x28) = pp_Var1;
    pcStack_1b0 = std::
                  _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                  ::_M_invoke;
    local_1b8 = std::
                _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp:450:7)>
                ::_M_manager;
    if (local_1f8 != (code)0x0) {
      if ((code *)local_218._16_8_ != (code *)0x0) {
        (*(code *)local_218._16_8_)(local_218,local_218,3);
      }
      local_1f8 = (code)0x0;
    }
    if (delegate == (ProcessDelegate *)0x0) {
      delegate = &((this->super_ExecutionQueue).delegate)->super_ProcessDelegate;
    }
    ctx = (ProcessContext *)*pQVar3[3]._vptr_QueueJobContext;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_a0.env,&local_168.env);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0.envStorage,&local_168.envStorage);
    this_00 = &local_a0.keys;
    local_a0.keys._M_h._M_buckets = (__buckets_ptr)0x0;
    local_a0.keys._M_h._M_bucket_count = local_168.keys._M_h._M_bucket_count;
    local_a0.keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0.keys._M_h._M_element_count = local_168.keys._M_h._M_element_count;
    local_a0.keys._M_h._M_rehash_policy._M_max_load_factor =
         local_168.keys._M_h._M_rehash_policy._M_max_load_factor;
    local_a0.keys._M_h._M_rehash_policy._4_4_ = local_168.keys._M_h._M_rehash_policy._4_4_;
    local_a0.keys._M_h._M_rehash_policy._M_next_resize =
         local_168.keys._M_h._M_rehash_policy._M_next_resize;
    local_a0.keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_218._0_8_ = this_00;
    std::
    _Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,true>>>>
              ((_Hashtable<llvm::StringRef,llvm::StringRef,std::allocator<llvm::StringRef>,std::__detail::_Identity,std::equal_to<llvm::StringRef>,std::hash<llvm::StringRef>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,&local_168.keys._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<llvm::StringRef,_true>_>_> *)
               local_218);
    local_a0.isFrozen = local_168.isFrozen;
    commandLine_00.Length = local_190;
    commandLine_00.Data = local_198;
    llbuild::basic::spawnProcess
              (delegate,ctx,&this->spawnedProcesses,local_1a8,commandLine_00,&local_a0,attributes,
               (ProcessReleaseFn *)&local_1e8,(ProcessCompletionFn *)&local_1c8);
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&this_00->_M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0.envStorage);
    if (local_a0.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b8 != (code *)0x0) {
      (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
    }
    if (local_1d8 != (code *)0x0) {
      (*local_1d8)(&local_1e8,&local_1e8,3);
    }
    std::
    _Hashtable<llvm::StringRef,_llvm::StringRef,_std::allocator<llvm::StringRef>,_std::__detail::_Identity,_std::equal_to<llvm::StringRef>,_std::hash<llvm::StringRef>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_168.keys._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168.envStorage);
    if (local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.env.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_f0 != local_e0) {
    free(local_f0);
  }
  return;
}

Assistant:

virtual void executeProcess(
      QueueJobContext* opaqueContext,
      ArrayRef<StringRef> commandLine,
      ArrayRef<std::pair<StringRef, StringRef>> environment,
      ProcessAttributes attributes,
      llvm::Optional<ProcessCompletionFn> completionFn,
      ProcessDelegate* delegate
  ) override {

    LaneBasedExecutionQueueJobContext& context =
      *reinterpret_cast<LaneBasedExecutionQueueJobContext*>(opaqueContext);

    llvm::SmallString<64> description;
    context.job.getDescriptor()->getShortDescription(description);
    TracingExecutionQueueSubprocessStart(context.laneNumber, description.str());

    {
      std::unique_lock<std::mutex> lock(readyJobsMutex);
      // Do not execute new processes anymore after cancellation.
      if (cancelled) {
        if (completionFn.hasValue())
          completionFn.getValue()(ProcessResult::makeCancelled());
        return;
      }
    }

    // Form the complete environment.
    //
    // NOTE: We construct the environment in order of precedence, so
    // overridden keys should be defined first.
    POSIXEnvironment posixEnv;

    // Export lane ID to subprocesses.
    posixEnv.setIfMissing("LLBUILD_BUILD_ID", Twine(buildID).str());
    posixEnv.setIfMissing("LLBUILD_LANE_ID", Twine(context.laneNumber).str());

    // Add the requested environment.
    for (const auto& entry: environment) {
      posixEnv.setIfMissing(entry.first, entry.second);
    }

    // Inherit the base environment, if desired.
    //
    // FIXME: This involves a lot of redundant allocation, currently. We could
    // cache this for the common case of a directly inherited environment.
    if (attributes.inheritEnvironment) {
      for (const char* const* p = this->environment; *p != nullptr; ++p) {
        auto pair = StringRef(*p).split('=');
        posixEnv.setIfMissing(pair.first, pair.second);
      }
    }

    // Assign a process handle, which just needs to be unique for as long as we
    // are communicating with the delegate.
    ProcessHandle handle;
    handle.id = context.jobID;

    ProcessReleaseFn releaseFn = [this](std::function<void()>&& processWait) {
      auto previousTaskCount = backgroundTaskCount.fetch_add(1);
      if (previousTaskCount < backgroundTaskMax) {
        // Launch the process wait on a detached thread
        std::thread([this, processWait=std::move(processWait)]() mutable {
          processWait();
          backgroundTaskCount--;
        }).detach();
      } else {
        backgroundTaskCount--;
        // not allowed to release, call wait directly
        processWait();
      }
    };

    ProcessCompletionFn laneCompletionFn{
      [completionFn, lane=context.laneNumber](ProcessResult result) mutable {
        TracingExecutionQueueSubprocessResult(lane, result.pid, result.utime,
                                              result.stime, result.maxrss);
        if (completionFn.hasValue())
          completionFn.getValue()(result);
      }
    };

    spawnProcess(
        delegate ? *delegate : getDelegate(),
        reinterpret_cast<ProcessContext*>(context.job.getDescriptor()),
        spawnedProcesses,
        handle,
        commandLine,
        posixEnv,
        attributes,
        std::move(releaseFn),
        std::move(laneCompletionFn)
    );
  }